

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.h
# Opt level: O0

void __thiscall soplex::SPxParMultPR<double>::SPxParMultPR(SPxParMultPR<double> *this)

{
  char *in_RDI;
  SPxPricer<double> *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp> *in_stack_fffffffffffffff0;
  
  SPxPricer<double>::SPxPricer(unaff_retaddr,in_RDI);
  *(undefined ***)in_RDI = &PTR_getName_004ee4b0;
  Array<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>::Array
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  in_RDI[0x58] = '\0';
  in_RDI[0x59] = '\0';
  in_RDI[0x5a] = '\0';
  in_RDI[0x5b] = '\0';
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  in_RDI[0x60] = '\x11';
  in_RDI[0x61] = '\0';
  in_RDI[0x62] = '\0';
  in_RDI[99] = '\0';
  return;
}

Assistant:

SPxParMultPR()
      : SPxPricer<R>("ParMult")
      , multiParts(0)
      , used(0)
      , min(0)
      , last(0)
      , partialSize(17)
   {}